

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommodoreTAP.cpp
# Opt level: O2

Pulse __thiscall Storage::Tape::CommodoreTAP::virtual_get_next_pulse(CommodoreTAP *this)

{
  FileHolder *this_00;
  byte bVar1;
  bool bVar2;
  Type TVar3;
  uint32_t uVar4;
  
  if (this->is_at_end_ == false) {
    TVar3 = High;
    if ((this->current_pulse_).type == High) {
      this_00 = &this->file_;
      bVar1 = FileHolder::get8(this_00);
      if ((bVar1 == 0) && (this->updated_layout_ != false)) {
        uVar4 = FileHolder::get24le(this_00);
      }
      else {
        uVar4 = (uint)bVar1 << 3;
      }
      bVar2 = FileHolder::eof(this_00);
      if (bVar2) {
        this->is_at_end_ = true;
        (this->current_pulse_).length.length = (this->current_pulse_).length.clock_rate;
        TVar3 = Zero;
      }
      else {
        (this->current_pulse_).length.length = uVar4;
        TVar3 = Low;
      }
    }
    (this->current_pulse_).type = TVar3;
  }
  return this->current_pulse_;
}

Assistant:

Storage::Tape::Tape::Pulse CommodoreTAP::virtual_get_next_pulse() {
	if(is_at_end_) {
		return current_pulse_;
	}

	if(current_pulse_.type == Pulse::High) {
		uint32_t next_length;
		uint8_t next_byte = file_.get8();
		if(!updated_layout_ || next_byte > 0) {
			next_length = uint32_t(next_byte) << 3;
		} else {
			next_length = file_.get24le();
		}

		if(file_.eof()) {
			is_at_end_ = true;
			current_pulse_.length.length = current_pulse_.length.clock_rate;
			current_pulse_.type = Pulse::Zero;
		} else {
			current_pulse_.length.length = next_length;
			current_pulse_.type = Pulse::Low;
		}
	} else {
		current_pulse_.type = Pulse::High;
	}

	return current_pulse_;
}